

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O0

void queue_declare(amqp_connection_state_t connection_state_,char *queue_name_)

{
  amqp_queue_declare_ok_t *paVar1;
  undefined8 in_RSI;
  amqp_boolean_t durable;
  undefined8 in_RDI;
  amqp_connection_state_t unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  amqp_boolean_t in_stack_00000020;
  amqp_boolean_t in_stack_00000028;
  amqp_table_t in_stack_00000030;
  amqp_queue_declare_ok_t *res;
  
  durable = (amqp_boolean_t)((ulong)in_RSI >> 0x20);
  amqp_cstring_bytes((char *)0x102612);
  paVar1 = amqp_queue_declare(unaff_retaddr,(amqp_channel_t)((ulong)in_RDI >> 0x30),
                              (amqp_bytes_t)in_stack_00000008,(amqp_boolean_t)in_RDI,durable,
                              in_stack_00000020,in_stack_00000028,in_stack_00000030);
  if (paVar1 != (amqp_queue_declare_ok_t *)0x0) {
    return;
  }
  __assert_fail("res != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                ,0x56,"void queue_declare(amqp_connection_state_t, const char *)");
}

Assistant:

void queue_declare(amqp_connection_state_t connection_state_,
                   const char *queue_name_) {
  amqp_queue_declare_ok_t *res = amqp_queue_declare(
      connection_state_, fixed_channel_id, amqp_cstring_bytes(queue_name_),
      /*passive*/ 0,
      /*durable*/ 0,
      /*exclusive*/ 0,
      /*auto_delete*/ 1, amqp_empty_table);
  assert(res != NULL);
}